

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_packing_pass.cpp
# Opt level: O0

bool spvtools::opt::isPackingScalar(PackingRules rules)

{
  bool local_9;
  PackingRules rules_local;
  
  local_9 = rules == Scalar || rules == ScalarEnhancedLayout;
  return local_9;
}

Assistant:

static bool isPackingScalar(StructPackingPass::PackingRules rules) {
  switch (rules) {
    case StructPackingPass::PackingRules::Scalar:
    case StructPackingPass::PackingRules::ScalarEnhancedLayout:
      return true;
    default:
      return false;
  }
}